

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

VRDatumPtr * __thiscall MinVR::VRDatumPtr::operator=(VRDatumPtr *this,VRDatumPtr *sp)

{
  int iVar1;
  VRDatumPtr *in_RSI;
  VRDatumPtr *in_RDI;
  
  if (in_RDI != in_RSI) {
    iVar1 = VRDatumPtrRC::release(in_RDI->reference);
    if (iVar1 == 0) {
      if (in_RDI->pData != (VRDatum_conflict *)0x0) {
        (*in_RDI->pData->_vptr_VRDatum[1])();
      }
      if (in_RDI->reference != (VRDatumPtrRC *)0x0) {
        operator_delete(in_RDI->reference,4);
      }
    }
    in_RDI->pData = in_RSI->pData;
    in_RDI->reference = in_RSI->reference;
    VRDatumPtrRC::addRef(in_RDI->reference);
  }
  return in_RDI;
}

Assistant:

VRDatumPtr& operator = (const VRDatumPtr& sp)
  {
    // Assignment operator
    if (this != &sp) // Avoid self assignment
      {
        // Decrement the old reference count.  If references become
        // zero, delete the data.
        if(reference->release() == 0)
          {
            delete pData;
            delete reference;
          }

        // Copy the data and reference pointer and increment the
        // reference count
        pData = sp.pData;
        reference = sp.reference;
        reference->addRef();
      }
    return *this;
  }